

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::XMLGrammarPoolImpl::orphanGrammar(XMLGrammarPoolImpl *this,XMLCh *nameSpaceKey)

{
  int iVar1;
  Grammar *grammar;
  XMLCh *nameSpaceKey_local;
  XMLGrammarPoolImpl *this_local;
  
  if ((this->fLocked & 1U) == 0) {
    this_local = (XMLGrammarPoolImpl *)
                 RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::orphanKey
                           (this->fGrammarRegistry,nameSpaceKey);
    if ((((this->fXSModelIsValid & 1U) != 0) && (this_local != (XMLGrammarPoolImpl *)0x0)) &&
       (iVar1 = (*(this_local->super_XMLGrammarPool)._vptr_XMLGrammarPool[5])(), iVar1 == 1)) {
      this->fXSModelIsValid = false;
    }
  }
  else {
    this_local = (XMLGrammarPoolImpl *)0x0;
  }
  return (Grammar *)this_local;
}

Assistant:

Grammar* XMLGrammarPoolImpl::orphanGrammar(const XMLCh* const nameSpaceKey)
{
    if (!fLocked)
    {
        Grammar* grammar = fGrammarRegistry->orphanKey(nameSpaceKey);
        if (fXSModelIsValid && grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType)
        {
            fXSModelIsValid = false;
        }
        return grammar;
    }
    return 0;
}